

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll_action.cpp
# Opt level: O0

bool __thiscall cppnet::EpollEventActions::AddSendEvent(EpollEventActions *this,Event *event)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> ev;
  bool bVar1;
  uint16_t uVar2;
  SingletonLogger *pSVar3;
  element_type *this_00;
  uint64_t sock_00;
  undefined1 local_38 [8];
  shared_ptr<cppnet::Socket> sock;
  epoll_event *ep_event;
  Event *event_local;
  EpollEventActions *this_local;
  
  uVar2 = Event::GetType(event);
  if ((uVar2 & 2) == 0) {
    Event::AddType(event,ET_WRITE);
    sock.super___shared_ptr<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)Event::GetData(event);
    if ((sock.super___shared_ptr<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
       (bVar1 = MakeEpollEvent(this,event,
                               (epoll_event **)
                               &sock.super___shared_ptr<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount), bVar1)) {
      if (((ulong)(sock.super___shared_ptr<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi)->_vptr__Sp_counted_base & 4) == 0) {
        Event::GetSocket((Event *)local_38);
        bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_38);
        ev = sock.super___shared_ptr<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        if (bVar1) {
          this_00 = std::
                    __shared_ptr_access<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)local_38);
          sock_00 = Socket::GetSocket(this_00);
          uVar2 = Event::GetType(event);
          bVar1 = AddEvent(this,(epoll_event *)ev._M_pi,4,sock_00,(bool)((byte)uVar2 >> 7));
          if (bVar1) {
            Event::AddType(event,ET_INACTIONS);
            this_local._7_1_ = true;
          }
          else {
            pSVar3 = Singleton<cppnet::SingletonLogger>::Instance();
            SingletonLogger::Warn
                      (pSVar3,
                       "/workspace/llm4binary/github/license_c_cmakelists/caozhiyi[P]CppNet/cppnet/event/epoll/epoll_action.cpp"
                       ,0x82,"add event to socket failed! event %s","AddSendEvent");
            this_local._7_1_ = false;
          }
        }
        else {
          pSVar3 = Singleton<cppnet::SingletonLogger>::Instance();
          SingletonLogger::Warn
                    (pSVar3,
                     "/workspace/llm4binary/github/license_c_cmakelists/caozhiyi[P]CppNet/cppnet/event/epoll/epoll_action.cpp"
                     ,0x79,"socket is already destroyed! event %s","AddSendEvent");
          this_local._7_1_ = false;
        }
        std::shared_ptr<cppnet::Socket>::~shared_ptr((shared_ptr<cppnet::Socket> *)local_38);
      }
      else {
        this_local._7_1_ = true;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool EpollEventActions::AddSendEvent(Event* event) {
    if (event->GetType() & ET_WRITE) {
        return false;
    }
    event->AddType(ET_WRITE);

    epoll_event* ep_event = (epoll_event*)event->GetData();
    if (!ep_event) {
        if (!MakeEpollEvent(event, ep_event)) {
            return false;
        }
    }

    // already in EPOLL
    if (ep_event->events & EPOLLOUT) {
        return true;
    }

    auto sock = event->GetSocket();
    if (!sock) {
        LOG_WARN("socket is already destroyed! event %s", "AddSendEvent");
        return false;
    }

    if (AddEvent(ep_event, EPOLLOUT, sock->GetSocket(), event->GetType() & ET_INACTIONS)) {
        event->AddType(ET_INACTIONS);
        return true;
    }

    LOG_WARN("add event to socket failed! event %s", "AddSendEvent");
    return false;
}